

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

ConstraintDB * __thiscall Clasp::Solver::allocUndo(Solver *this,Constraint *c)

{
  allocator_type *a;
  reference ppCVar1;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *in_RDI;
  ConstraintDB *r;
  allocator_type *paVar2;
  Constraint **in_stack_ffffffffffffffb8;
  size_type n;
  undefined1 local_19 [17];
  allocator_type *local_8;
  
  if (in_RDI[9].ebo_.buf == (pointer)0x0) {
    a = (allocator_type *)operator_new(0x10);
    n = (size_type)((ulong)local_19 >> 0x20);
    paVar2 = a;
    std::allocator<Clasp::Constraint_*>::allocator((allocator<Clasp::Constraint_*> *)0x1ec2cd);
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pod_vector
              (in_RDI,n,(Constraint **)paVar2,a);
    local_8 = a;
    std::allocator<Clasp::Constraint_*>::~allocator((allocator<Clasp::Constraint_*> *)0x1ec300);
  }
  else {
    paVar2 = (allocator_type *)in_RDI[9].ebo_.buf;
    ppCVar1 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::front
                        ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                         in_RDI[9].ebo_.buf);
    in_RDI[9].ebo_.buf = (pointer)*ppCVar1;
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::clear
              ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)paVar2);
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
              (in_RDI,in_stack_ffffffffffffffb8);
    local_8 = paVar2;
  }
  return (ConstraintDB *)local_8;
}

Assistant:

Solver::ConstraintDB* Solver::allocUndo(Constraint* c) {
	if (undoHead_ == 0) {
		return new ConstraintDB(1, c);
	}
	assert(undoHead_->size() == 1);
	ConstraintDB* r = undoHead_;
	undoHead_ = (ConstraintDB*)undoHead_->front();
	r->clear();
	r->push_back(c);
	return r;
}